

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayImpDirWrapper.cpp
# Opt level: O0

addr_type __thiscall
DelayImpFuncWrapper::containsAddrType(DelayImpFuncWrapper *this,size_t fId,size_t subField)

{
  uint64_t offset_00;
  addr_type aT;
  uint64_t offset;
  size_t sStack_28;
  bool isOk;
  size_t subField_local;
  size_t fId_local;
  DelayImpFuncWrapper *this_local;
  
  offset._7_1_ = 0;
  sStack_28 = subField;
  subField_local = fId;
  fId_local = (size_t)this;
  offset_00 = ExeElementWrapper::getNumValue
                        ((ExeElementWrapper *)this,fId,(bool *)((long)&offset + 7));
  if ((((offset._7_1_ & 1) == 0) || (offset_00 == 0xffffffffffffffff)) || (offset_00 == 0)) {
    this_local._4_4_ = NOT_ADDR;
  }
  else {
    this_local._4_4_ =
         Executable::detectAddrType
                   ((this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                    super_ExeElementWrapper.m_Exe,offset_00,RVA);
    if (3 < subField_local) {
      this_local._4_4_ = NOT_ADDR;
    }
  }
  return this_local._4_4_;
}

Assistant:

Executable::addr_type DelayImpFuncWrapper::containsAddrType(size_t fId, size_t subField)
{
    bool isOk = false;
    uint64_t offset = this->getNumValue(fId, &isOk);
    if (!isOk || offset == INVALID_ADDR || offset == 0) return Executable::NOT_ADDR;

    Executable::addr_type aT = m_Exe->detectAddrType(offset, Executable::RVA);
    switch (fId) {
        case IAT_ADDR :
        case NAMETHUNK_ADDR :
        case BOUND_IAT_ADDR :
        case UNLOAD_IAT_ADDR :
            return aT;
    }
    return Executable::NOT_ADDR;
}